

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,false,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  sel_t sVar12;
  idx_t iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  
  if (count + 0x3f < 0x40) {
    iVar13 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar13 = 0;
    lVar16 = 0;
    uVar18 = 0;
    uVar21 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar21 + 0x40;
        if (count <= uVar21 + 0x40) {
          uVar8 = count;
        }
LAB_00f2122d:
        uVar11 = uVar21;
        if (uVar21 < uVar8) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar15 = uVar21 << 4 | 8;
          do {
            uVar11 = uVar21;
            if (psVar2 != (sel_t *)0x0) {
              uVar11 = (ulong)psVar2[uVar21];
            }
            lVar5 = *(long *)((long)&rdata->months + uVar15);
            lVar9 = (long)*(int *)((long)rdata + (uVar15 - 4)) + lVar5 / 86400000000;
            lVar19 = lVar9 % 0x1e;
            lVar20 = (long)*(int *)((long)rdata + (uVar15 - 8)) + lVar9 / 0x1e;
            lVar9 = *(long *)((long)&ldata->months + uVar15);
            lVar10 = (long)*(int *)((long)ldata + (uVar15 - 4)) + lVar9 / 86400000000;
            lVar14 = lVar10 % 0x1e;
            lVar10 = (long)*(int *)((long)ldata + (uVar15 - 8)) + lVar10 / 0x1e;
            if (lVar10 < lVar20) {
              bVar6 = false;
            }
            else {
              bVar6 = true;
              if (lVar10 <= lVar20) {
                if (lVar14 < lVar19) {
                  bVar6 = false;
                }
                else {
                  bVar6 = lVar5 % 86400000000 <= lVar9 % 86400000000 || lVar19 < lVar14;
                }
              }
            }
            psVar3[iVar13] = (sel_t)uVar11;
            iVar13 = iVar13 + bVar6;
            psVar4[lVar16] = (sel_t)uVar11;
            lVar16 = (ulong)(bVar6 ^ 1) + lVar16;
            uVar21 = uVar21 + 1;
            uVar15 = uVar15 + 0x10;
            uVar11 = uVar8;
          } while (uVar8 != uVar21);
        }
      }
      else {
        uVar15 = puVar1[uVar18];
        uVar8 = uVar21 + 0x40;
        if (count <= uVar21 + 0x40) {
          uVar8 = count;
        }
        if (uVar15 == 0xffffffffffffffff) goto LAB_00f2122d;
        uVar11 = uVar8;
        if (uVar15 == 0) {
          if (uVar21 < uVar8) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              sVar12 = (sel_t)uVar21;
              if (psVar2 != (sel_t *)0x0) {
                sVar12 = psVar2[uVar21];
              }
              psVar3[lVar16] = sVar12;
              lVar16 = lVar16 + 1;
              uVar21 = uVar21 + 1;
            } while (uVar8 != uVar21);
          }
        }
        else {
          uVar11 = uVar21;
          if (uVar21 < uVar8) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            uVar7 = uVar21 << 4 | 8;
            uVar17 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar12 = (int)uVar21 + (int)uVar17;
              }
              else {
                sVar12 = psVar2[uVar21 + uVar17];
              }
              if ((uVar15 >> (uVar17 & 0x3f) & 1) == 0) {
LAB_00f21570:
                bVar6 = false;
              }
              else {
                lVar5 = *(long *)((long)&rdata->months + uVar7);
                lVar9 = (long)*(int *)((long)rdata + (uVar7 - 4)) + lVar5 / 86400000000;
                lVar19 = lVar9 % 0x1e;
                lVar20 = (long)*(int *)((long)rdata + (uVar7 - 8)) + lVar9 / 0x1e;
                lVar9 = *(long *)((long)&ldata->months + uVar7);
                lVar10 = (long)*(int *)((long)ldata + (uVar7 - 4)) + lVar9 / 86400000000;
                lVar14 = lVar10 % 0x1e;
                lVar10 = (long)*(int *)((long)ldata + (uVar7 - 8)) + lVar10 / 0x1e;
                if (lVar10 < lVar20) {
                  bVar6 = false;
                }
                else {
                  bVar6 = true;
                  if (lVar10 <= lVar20) {
                    if (lVar14 < lVar19) goto LAB_00f21570;
                    bVar6 = lVar5 % 86400000000 <= lVar9 % 86400000000 || lVar19 < lVar14;
                  }
                }
              }
              psVar3[iVar13] = sVar12;
              iVar13 = iVar13 + bVar6;
              psVar4[lVar16] = sVar12;
              lVar16 = (ulong)(bVar6 ^ 1) + lVar16;
              uVar17 = uVar17 + 1;
              uVar7 = uVar7 + 0x10;
              uVar11 = uVar8;
            } while (uVar8 - uVar21 != uVar17);
          }
        }
      }
      uVar18 = uVar18 + 1;
      uVar21 = uVar11;
    } while (uVar18 != count + 0x3f >> 6);
  }
  return iVar13;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}